

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subvq.c
# Opt level: O0

void subvq_subvec_eval_logs3(subvq_t *vq,float32 *feat,int32 s,logmath_t *logmath)

{
  int32 *piVar1;
  int32 *featdim;
  int32 i;
  logmath_t *logmath_local;
  int32 s_local;
  float32 *feat_local;
  subvq_t *vq_local;
  
  piVar1 = vq->featdim[s];
  for (featdim._4_4_ = 0; featdim._4_4_ < vq->gautbl[s].veclen; featdim._4_4_ = featdim._4_4_ + 1) {
    vq->subvec[featdim._4_4_] = feat[piVar1[featdim._4_4_]];
  }
  vector_gautbl_eval_logs3(vq->gautbl + s,0,vq->vqsize,vq->subvec,vq->vqdist[s],logmath);
  return;
}

Assistant:

void
subvq_subvec_eval_logs3(subvq_t * vq, float32 * feat, int32 s, logmath_t * logmath)
{
    int32 i;
    int32 *featdim;

    /* Extract subvector from feat */
    featdim = vq->featdim[s];
    for (i = 0; i < vq->gautbl[s].veclen; i++)
        vq->subvec[i] = feat[featdim[i]];

    /* Evaluate distances between extracted subvector and corresponding codebook */
    vector_gautbl_eval_logs3(&(vq->gautbl[s]), 0, vq->vqsize, vq->subvec,
                             vq->vqdist[s], logmath);
}